

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Cancel_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Resupply_Cancel_PDU::Resupply_Cancel_PDU
          (Resupply_Cancel_PDU *this,EntityIdentifier *ReceivingEntity,
          EntityIdentifier *SupplyingEntity)

{
  KUINT16 KVar1;
  
  Logistics_Header::Logistics_Header(&this->super_Logistics_Header);
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Cancel_PDU_00214db0;
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui8PDUType = '\b';
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui16PDULength = 0x18;
  KVar1 = (ReceivingEntity->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Logistics_Header).m_ReceivingEntity.super_SimulationIdentifier.m_ui16SiteID =
       (ReceivingEntity->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Logistics_Header).m_ReceivingEntity.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar1;
  *(undefined2 *)
   &(this->super_Logistics_Header).m_ReceivingEntity.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ReceivingEntity->super_SimulationIdentifier).field_0xc;
  KVar1 = (SupplyingEntity->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Logistics_Header).m_SupplyingEntity.super_SimulationIdentifier.m_ui16SiteID =
       (SupplyingEntity->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Logistics_Header).m_SupplyingEntity.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar1;
  *(undefined2 *)
   &(this->super_Logistics_Header).m_SupplyingEntity.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(SupplyingEntity->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

Resupply_Cancel_PDU::Resupply_Cancel_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity )
{
    m_ui8PDUType = Resupply_Cancel_PDU_Type;
    m_ui16PDULength = RESUPPLY_CANCEL_PDU_SIZE;
    m_ReceivingEntity = ReceivingEntity;
    m_SupplyingEntity = SupplyingEntity;
}